

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  int iVar1;
  int rc;
  char **in_stack_00000050;
  char *in_stack_00000058;
  char *in_stack_00000060;
  sqlite3 *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffd8;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x1454c2);
  iVar1 = sqlite3LoadExtension
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050);
  iVar1 = sqlite3ApiExit((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
  sqlite3_mutex_leave((sqlite3_mutex *)0x1454ff);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}